

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildBrReg1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,uint targetOffset,RegSlot srcRegSlot)

{
  int iVar1;
  RegOpnd *srcOpnd;
  undefined4 extraout_var;
  AddrOpnd *src2Opnd;
  BranchInstr *branchInstr;
  undefined6 in_register_00000032;
  
  srcOpnd = BuildSrcOpnd(this,srcRegSlot,TyVar);
  if ((int)CONCAT62(in_register_00000032,newOpcode) == 0x107) {
    iVar1 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[4])();
    src2Opnd = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar1),AddrOpndKindDynamicVar,this->m_func,
                                 false,(Var)0x0);
    branchInstr = IR::BranchInstr::New
                            (BrNotAddr_A,(LabelInstr *)0x0,&srcOpnd->super_Opnd,
                             &src2Opnd->super_Opnd,this->m_func);
  }
  else {
    branchInstr = IR::BranchInstr::New
                            (newOpcode,(LabelInstr *)0x0,&srcOpnd->super_Opnd,this->m_func);
  }
  AddBranchInstr(this,branchInstr,offset,targetOffset);
  return;
}

Assistant:

void
IRBuilder::BuildBrReg1(Js::OpCode newOpcode, uint32 offset, uint targetOffset, Js::RegSlot srcRegSlot)
{
    IR::BranchInstr * branchInstr;
    IR::RegOpnd *     srcOpnd;
    srcOpnd = this->BuildSrcOpnd(srcRegSlot);

    if (newOpcode == Js::OpCode::BrNotUndecl_A) {
        IR::AddrOpnd *srcOpnd2 = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetUndeclBlockVarAddr(),
            IR::AddrOpndKindDynamicVar, this->m_func);
        branchInstr = IR::BranchInstr::New(Js::OpCode::BrNotAddr_A, nullptr, srcOpnd, srcOpnd2, m_func);
    } else {
        branchInstr = IR::BranchInstr::New(newOpcode, nullptr, srcOpnd, m_func);
    }

    this->AddBranchInstr(branchInstr, offset, targetOffset);
}